

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<std::pair<cs_impl::any,_cs_impl::any>_> * __thiscall
cs::
allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
::alloc<cs_impl::any,cs_impl::any>
          (allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,_cs_impl::any>_>,_64UL,_cs_impl::default_allocator_provider>
           *this,any *args,any *args_1)

{
  __int_type _Var1;
  proxy *ppVar2;
  holder<std::pair<cs_impl::any,_cs_impl::any>_> *in_RDX;
  new_allocator<cs_impl::any::holder<std::pair<cs_impl::any,_cs_impl::any>_>_> *in_RSI;
  any *in_RDI;
  holder<std::pair<cs_impl::any,_cs_impl::any>_> *ptr;
  void *pvVar3;
  
  pvVar3 = (void *)0x0;
  if (in_RDI[0x41].mDat != (proxy *)0x0) {
    _Var1 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDX);
    if (_Var1 == 0) {
      ppVar2 = in_RDI[0x41].mDat;
      in_RDI[0x41].mDat = (proxy *)((long)&ppVar2[-1].data + 7);
      ppVar2 = in_RDI[(long)((long)&ppVar2[-1].data + 7)].mDat;
      goto LAB_00525534;
    }
  }
  ppVar2 = (proxy *)__gnu_cxx::
                    new_allocator<cs_impl::any::holder<std::pair<cs_impl::any,_cs_impl::any>_>_>::
                    allocate(in_RSI,(size_type)in_RDX,pvVar3);
LAB_00525534:
  __gnu_cxx::new_allocator<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>>::
  construct<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>,cs_impl::any,cs_impl::any>
            (in_RSI,in_RDX,(any *)ppVar2,in_RDI);
  return (holder<std::pair<cs_impl::any,_cs_impl::any>_> *)ppVar2;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}